

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_file_system_posix.cxx
# Opt level: O0

xr_reader * __thiscall xray_re::xr_file_system::r_open(xr_file_system *this,char *path)

{
  uint uVar1;
  ulong __size;
  uint8_t *data_00;
  value_type_conflict *__filename;
  FILE *__stream;
  size_t sVar2;
  FILE *infile;
  uintmax_t len;
  uint8_t *data;
  xr_reader *r;
  CPath p;
  char *path_local;
  xr_file_system *this_local;
  
  p.super_path._32_8_ = path;
  CPath::CPath((CPath *)&r,path);
  data = (uint8_t *)0x0;
  CPath::make_preferred_abi_cxx11_((CPath *)&r);
  __size = std::filesystem::file_size((path *)&r);
  uVar1 = std::numeric_limits<unsigned_int>::max();
  if (uVar1 < __size) {
    this_local = (xr_file_system *)0x0;
  }
  else {
    data_00 = (uint8_t *)malloc(__size);
    if (data_00 != (uint8_t *)0x0) {
      __filename = std::filesystem::__cxx11::path::c_str((path *)&r);
      __stream = fopen(__filename,"r");
      if ((__stream == (FILE *)0x0) || (sVar2 = fread(data_00,1,__size,__stream), sVar2 != __size))
      {
        free(data_00);
      }
      else {
        data = (uint8_t *)operator_new(0x28);
        xr_temp_reader::xr_temp_reader((xr_temp_reader *)data,data_00,__size);
      }
    }
    this_local = (xr_file_system *)data;
  }
  CPath::~CPath((CPath *)&r);
  return (xr_reader *)this_local;
}

Assistant:

xr_reader* xr_file_system::r_open(const char* path) const
{
using namespace std;

CPath p(path);
xr_reader* r = nullptr;
uint8_t* data;
uintmax_t len;

	p.make_preferred();
	len = fs::file_size(p);
	if(len > numeric_limits<uint32_t>::max())
		return nullptr;

	data = (uint8_t*)malloc(len);
	if(data != nullptr)
	{
		FILE* infile = fopen(p.c_str(), "r");

		if((infile != nullptr) && (fread(data, 1, len, infile) == len))
			r = new xr_temp_reader(data, len);
		else
			free(data);
	}

	return r;
}